

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O0

void __thiscall
bloaty::RangeMapTest_Translation2_Test::RangeMapTest_Translation2_Test
          (RangeMapTest_Translation2_Test *this)

{
  RangeMapTest *in_RDI;
  
  RangeMapTest::RangeMapTest(in_RDI);
  (in_RDI->super_Test)._vptr_Test = (_func_int **)&PTR__RangeMapTest_Translation2_Test_00914fb0;
  return;
}

Assistant:

TEST_F(RangeMapTest, Translation2) {
  map_.AddRange(5, 5, "foo");
  map_.AddDualRange(20, 5, 120, "bar");
  map_.AddRange(25, 5, "baz");
  map_.AddDualRange(30, 5, 130, "quux");
  CheckConsistency();
  AssertMainMapEquals({
    {5, 10, kNoTranslation, "foo"},
    {20, 25, 120, "bar"},
    {25, 30, kNoTranslation, "baz"},
    {30, 35, 130, "quux"}
  });

  ASSERT_TRUE(map2_.AddRangeWithTranslation(20, 15, "translate me", map_, false,
                                            &map3_));
  CheckConsistency();
  AssertMapEquals(map2_, {
    {20, 25, kNoTranslation, "translate me"},
    {25, 30, kNoTranslation, "translate me"},
    {30, 35, kNoTranslation, "translate me"}
  });
  AssertMapEquals(map3_, {
    {120, 125, kNoTranslation, "translate me"},
    {130, 135, kNoTranslation, "translate me"}
  });
}